

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

Type * __thiscall
spvtools::opt::analysis::ConstantManager::GetType(ConstantManager *this,Instruction *inst)

{
  uint32_t id;
  TypeManager *this_00;
  Type *pTVar1;
  
  this_00 = IRContext::get_type_mgr(this->ctx_);
  id = Instruction::type_id(inst);
  pTVar1 = TypeManager::GetType(this_00,id);
  return pTVar1;
}

Assistant:

Type* ConstantManager::GetType(const Instruction* inst) const {
  return context()->get_type_mgr()->GetType(inst->type_id());
}